

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileImporter::countObjects
          (ObjFileImporter *this,
          vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_> *rObjects,
          int *iNumMeshes)

{
  bool bVar1;
  size_type sVar2;
  reference ppOVar3;
  __normal_iterator<Assimp::ObjFile::Object_*const_*,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
  local_30;
  __normal_iterator<Assimp::ObjFile::Object_*const_*,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
  local_28;
  const_iterator it;
  int *iNumMeshes_local;
  vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_> *rObjects_local;
  ObjFileImporter *this_local;
  
  *iNumMeshes = 0;
  it._M_current = (Object **)iNumMeshes;
  bVar1 = std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::empty
                    (rObjects);
  if (!bVar1) {
    sVar2 = std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::size
                      (rObjects);
    *(int *)it._M_current = (int)sVar2 + *(int *)it._M_current;
    local_28._M_current =
         (Object **)
         std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::begin
                   (rObjects);
    while( true ) {
      local_30._M_current =
           (Object **)
           std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::end
                     (rObjects);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      ppOVar3 = __gnu_cxx::
                __normal_iterator<Assimp::ObjFile::Object_*const_*,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
                ::operator*(&local_28);
      bVar1 = std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::
              empty(&(*ppOVar3)->m_SubObjects);
      if (!bVar1) {
        ppOVar3 = __gnu_cxx::
                  __normal_iterator<Assimp::ObjFile::Object_*const_*,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
                  ::operator*(&local_28);
        countObjects(this,&(*ppOVar3)->m_SubObjects,(int *)it._M_current);
      }
      __gnu_cxx::
      __normal_iterator<Assimp::ObjFile::Object_*const_*,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
      ::operator++(&local_28);
    }
  }
  return;
}

Assistant:

void ObjFileImporter::countObjects(const std::vector<ObjFile::Object*> &rObjects, int &iNumMeshes)
{
    iNumMeshes = 0;
    if ( rObjects.empty() )
        return;

    iNumMeshes += static_cast<unsigned int>( rObjects.size() );
    for (std::vector<ObjFile::Object*>::const_iterator it = rObjects.begin();
        it != rObjects.end();
        ++it)
    {
        if (!(*it)->m_SubObjects.empty())
        {
            countObjects((*it)->m_SubObjects, iNumMeshes);
        }
    }
}